

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

char * restrict_bit_name(long *restrict_flags)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  restrict_type *prVar4;
  double dVar5;
  
  restrict_bit_name::buf[0] = '\0';
  for (prVar4 = restrict_table; prVar4->name != (char *)0x0; prVar4 = prVar4 + 1) {
    uVar1 = restrict_flags[(int)(prVar4->bit / 0x20)];
    dVar5 = exp2((double)(prVar4->bit % 0x20));
    if ((uVar1 & (long)dVar5) != 0) {
      sVar2 = strlen(restrict_bit_name::buf);
      (restrict_bit_name::buf + sVar2)[0] = ' ';
      (restrict_bit_name::buf + sVar2)[1] = '\0';
      pcVar3 = palloc_string(prVar4->name);
      strcat(restrict_bit_name::buf,pcVar3);
    }
  }
  pcVar3 = restrict_bit_name::buf;
  if (restrict_bit_name::buf[0] == '\0') {
    pcVar3 = " none";
  }
  return pcVar3 + 1;
}

Assistant:

char *restrict_bit_name(long restrict_flags[])
{
	static char buf[512];
	buf[0] = '\0';

	for (int i = 0; restrict_table[i].name != nullptr; i++)
	{
		if (IS_SET(restrict_flags, restrict_table[i].bit))
		{
			strcat(buf, " ");
			strcat(buf, palloc_string(restrict_table[i].name));
		}
	}

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}